

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of.h
# Opt level: O2

void __thiscall
kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>::destroy
          (OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *this)

{
  destroyVariant<kj::HttpInputStream::Request>(this);
  destroyVariant<kj::HttpInputStream::Connect>(this);
  return;
}

Assistant:

void destroy() {
    doAll(destroyVariant<Variants>()...);
  }